

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.h
# Opt level: O2

void __thiscall pstack::Elf::Object::~Object(Object *this)

{
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                 *)(this + 0x168));
  std::unique_ptr<pstack::Elf::GnuHash,_std::default_delete<pstack::Elf::GnuHash>_>::~unique_ptr
            ((unique_ptr<pstack::Elf::GnuHash,_std::default_delete<pstack::Elf::GnuHash>_> *)
             (this + 0x160));
  std::unique_ptr<pstack::Elf::SymHash,_std::default_delete<pstack::Elf::SymHash>_>::~unique_ptr
            ((unique_ptr<pstack::Elf::SymHash,_std::default_delete<pstack::Elf::SymHash>_> *)
             (this + 0x158));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x150));
  std::unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>
               *)(this + 0x138));
  std::unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolSection,_std::default_delete<pstack::Elf::SymbolSection>_>
               *)(this + 0x130));
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
               *)(this + 0x100));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)(this + 0xd0));
  std::
  vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
  ::~vector((vector<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>,_std::allocator<std::unique_ptr<pstack::Elf::Section,_std::default_delete<pstack::Elf::Section>_>_>_>
             *)(this + 0xb8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x70));
  std::
  unique_ptr<pstack::Elf::SymbolVersioning,_std::default_delete<pstack::Elf::SymbolVersioning>_>::
  ~unique_ptr((unique_ptr<pstack::Elf::SymbolVersioning,_std::default_delete<pstack::Elf::SymbolVersioning>_>
               *)(this + 0x60));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48));
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>_>_>_>
               *)(this + 0x10));
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8));
  return;
}

Assistant:

~Object() noexcept = default;